

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memusage.h
# Opt level: O0

size_t memusage::MallocUsage(size_t alloc)

{
  long in_RDI;
  long in_FS_OFFSET;
  undefined8 local_10;
  
  if (in_RDI == 0) {
    local_10 = 0;
  }
  else {
    local_10 = in_RDI + 0x1fU & 0xfffffffffffffff0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static inline size_t MallocUsage(size_t alloc)
{
    // Measured on libc6 2.19 on Linux.
    if (alloc == 0) {
        return 0;
    } else if (sizeof(void*) == 8) {
        return ((alloc + 31) >> 4) << 4;
    } else if (sizeof(void*) == 4) {
        return ((alloc + 15) >> 3) << 3;
    } else {
        assert(0);
    }
}